

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O3

bool rsg::(anonymous_namespace)::isConversionOk<bool,int>(ConstValueRangeAccess valueRange)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (valueRange.m_min)->intVal;
  uVar2 = (valueRange.m_max)->intVal;
  if ((iVar1 == 0 || uVar2 != 0) &&
     ((int)(uint)(iVar1 != 0) <= (int)uVar2 && iVar1 <= (int)(uint)(iVar1 != 0))) {
    return (uVar2 != 0) <= uVar2 && iVar1 <= (int)(uint)(uVar2 != 0);
  }
  return false;
}

Assistant:

ConstValueAccess			getMin					(void) const	{ return ConstValueAccess(*m_type, m_min);	}